

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverter *
ucnv_createConverterFromSharedData_63
          (UConverter *myUConverter,UConverterSharedData *mySharedConverterData,
          UConverterLoadArgs *pArgs,UErrorCode *err)

{
  UBool UVar1;
  undefined1 local_31;
  UBool isCopyLocal;
  UErrorCode *err_local;
  UConverterLoadArgs *pArgs_local;
  UConverterSharedData *mySharedConverterData_local;
  UConverter *myUConverter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if (myUConverter == (UConverter *)0x0) {
      mySharedConverterData_local = (UConverterSharedData *)uprv_malloc_63(0x120);
      if (mySharedConverterData_local == (UConverterSharedData *)0x0) {
        *err = U_MEMORY_ALLOCATION_ERROR;
        ucnv_unloadSharedDataIfReady_63(mySharedConverterData);
        return (UConverter *)0x0;
      }
      local_31 = 0;
    }
    else {
      local_31 = 1;
      mySharedConverterData_local = (UConverterSharedData *)myUConverter;
    }
    memset(mySharedConverterData_local,0,0x120);
    *(undefined1 *)((long)&(mySharedConverterData_local->mbcs).stateTable + 5) = local_31;
    *(UConverterSharedData **)&mySharedConverterData_local->mbcs = mySharedConverterData;
    *(uint32_t *)&(mySharedConverterData_local->mbcs).stateTable = pArgs->options;
    if (pArgs->onlyTestIsLoadable == '\0') {
      (mySharedConverterData_local->mbcs).sbcsIndex[0x34] = 0xffff;
      (mySharedConverterData_local->mbcs).sbcsIndex[0x35] = 0xffff;
      mySharedConverterData_local->dataMemory = UCNV_TO_U_CALLBACK_SUBSTITUTE_63;
      *(code **)mySharedConverterData_local = UCNV_FROM_U_CALLBACK_SUBSTITUTE_63;
      *(uint32_t *)&(mySharedConverterData_local->mbcs).unicodeCodeUnits =
           mySharedConverterData->toUnicodeStatus;
      *(int8_t *)&(mySharedConverterData_local->mbcs).fromUnicodeTable =
           mySharedConverterData->staticData->maxBytesPerChar;
      *(uint8_t *)((long)&(mySharedConverterData_local->mbcs).fromUnicodeTable + 6) =
           mySharedConverterData->staticData->subChar1;
      *(int8_t *)((long)&(mySharedConverterData_local->mbcs).fromUnicodeTable + 1) =
           mySharedConverterData->staticData->subCharLen;
      *(uint16_t **)&mySharedConverterData_local->toUnicodeStatus =
           (mySharedConverterData_local->mbcs).sbcsIndex + 0x10;
      memcpy(*(void **)&mySharedConverterData_local->toUnicodeStatus,
             mySharedConverterData->staticData->subChar,
             (long)*(char *)((long)&(mySharedConverterData_local->mbcs).fromUnicodeTable + 1));
      *(undefined4 *)((long)&(mySharedConverterData_local->mbcs).baseSharedData + 4) = 1;
    }
    if (mySharedConverterData->impl->open != (UConverterOpen)0x0) {
      (*mySharedConverterData->impl->open)((UConverter *)mySharedConverterData_local,pArgs,err);
      UVar1 = U_FAILURE(*err);
      if ((UVar1 != '\0') && (pArgs->onlyTestIsLoadable == '\0')) {
        ucnv_close_63((UConverter *)mySharedConverterData_local);
        return (UConverter *)0x0;
      }
    }
    myUConverter_local = (UConverter *)mySharedConverterData_local;
  }
  else {
    ucnv_unloadSharedDataIfReady_63(mySharedConverterData);
    myUConverter_local = myUConverter;
  }
  return myUConverter_local;
}

Assistant:

U_CFUNC UConverter*
ucnv_createConverterFromSharedData(UConverter *myUConverter,
                                   UConverterSharedData *mySharedConverterData,
                                   UConverterLoadArgs *pArgs,
                                   UErrorCode *err)
{
    UBool isCopyLocal;

    if(U_FAILURE(*err)) {
        ucnv_unloadSharedDataIfReady(mySharedConverterData);
        return myUConverter;
    }
    if(myUConverter == NULL)
    {
        myUConverter = (UConverter *) uprv_malloc (sizeof (UConverter));
        if(myUConverter == NULL)
        {
            *err = U_MEMORY_ALLOCATION_ERROR;
            ucnv_unloadSharedDataIfReady(mySharedConverterData);
            return NULL;
        }
        isCopyLocal = FALSE;
    } else {
        isCopyLocal = TRUE;
    }

    /* initialize the converter */
    uprv_memset(myUConverter, 0, sizeof(UConverter));
    myUConverter->isCopyLocal = isCopyLocal;
    /*myUConverter->isExtraLocal = FALSE;*/ /* Set by the memset call */
    myUConverter->sharedData = mySharedConverterData;
    myUConverter->options = pArgs->options;
    if(!pArgs->onlyTestIsLoadable) {
        myUConverter->preFromUFirstCP = U_SENTINEL;
        myUConverter->fromCharErrorBehaviour = UCNV_TO_U_DEFAULT_CALLBACK;
        myUConverter->fromUCharErrorBehaviour = UCNV_FROM_U_DEFAULT_CALLBACK;
        myUConverter->toUnicodeStatus = mySharedConverterData->toUnicodeStatus;
        myUConverter->maxBytesPerUChar = mySharedConverterData->staticData->maxBytesPerChar;
        myUConverter->subChar1 = mySharedConverterData->staticData->subChar1;
        myUConverter->subCharLen = mySharedConverterData->staticData->subCharLen;
        myUConverter->subChars = (uint8_t *)myUConverter->subUChars;
        uprv_memcpy(myUConverter->subChars, mySharedConverterData->staticData->subChar, myUConverter->subCharLen);
        myUConverter->toUCallbackReason = UCNV_ILLEGAL; /* default reason to invoke (*fromCharErrorBehaviour) */
    }

    if(mySharedConverterData->impl->open != NULL) {
        mySharedConverterData->impl->open(myUConverter, pArgs, err);
        if(U_FAILURE(*err) && !pArgs->onlyTestIsLoadable) {
            /* don't ucnv_close() if onlyTestIsLoadable because not fully initialized */
            ucnv_close(myUConverter);
            return NULL;
        }
    }

    return myUConverter;
}